

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCheatSheetTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheatSheet_bar_Test::~TEST_MockCheatSheet_bar_Test(TEST_MockCheatSheet_bar_Test *this)

{
  TEST_MockCheatSheet_bar_Test *this_local;
  
  ~TEST_MockCheatSheet_bar_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockCheatSheet, bar)
{
    /* Expect 2 calls on Bar. Check only one parameter */
    mock().expectNCalls(2, "Bar")
        .withParameter("param_double", 1.5)
        .ignoreOtherParameters();

    /* And the production code call */
    productionCodeBarCalls();
}